

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxToken.cpp
# Opt level: O3

string * __thiscall
psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Category category)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "[keywords]";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "[identifiers]";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "[constants]";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "[string literals]";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "[punctuators]";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "[unrecognized]";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(SyntaxToken::Category category)
{
    switch (category) {
        case SyntaxToken::Category::Keywords:
            return "[keywords]";

        case SyntaxToken::Category::Identifiers:
            return "[identifiers]";

        case SyntaxToken::Category::Constants:
            return "[constants]";

        case SyntaxToken::Category::StringLiterals:
            return "[string literals]";

        case SyntaxToken::Category::Punctuators:
            return "[punctuators]";

        default:
            return "[unrecognized]";
    }
}